

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void __thiscall
LZ77Compressor::DefaultEncode::operator()
          (DefaultEncode *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,Item item)

{
  value_type_conflict1 *__x;
  uint8_t b1;
  uint8_t b2;
  byte local_12;
  value_type_conflict1 local_11;
  undefined4 local_10;
  undefined2 local_c;
  
  local_10 = item._0_4_;
  local_c = item.field_1._2_2_;
  if (((uint6)item & 1) == 0) {
    __x = (value_type_conflict1 *)((long)&local_10 + 2);
  }
  else {
    local_12 = (byte)((uint6)item >> 0x24) & 0xf0 | item.field_1._0_1_;
    local_11 = item.field_1._2_1_;
    if (this->isSwitch == true) {
      local_12 = item.field_1._0_1_ << 4 | local_12 >> 4;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,&local_12);
    __x = &local_11;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,__x);
  return;
}

Assistant:

void operator()(std::vector<uint8_t>& out, Item item) {
			if (item.isRepeat) {
				uint8_t b1 = item.length | ((item.offset >> 4) & 0xF0);
				uint8_t b2 = item.offset & 0xFF;
				if (isSwitch) {
					b1 = (b1 >> 4) | (b1 << 4);
				}
				out.push_back(b1);
				out.push_back(b2);
			} else {
				out.push_back(item.value);
			}
		}